

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DefaultDecayTimeDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultDecayTimeDirectiveSyntax,slang::syntax::DefaultDecayTimeDirectiveSyntax_const&>
          (BumpAllocator *this,DefaultDecayTimeDirectiveSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  SyntaxKind SVar11;
  undefined4 uVar12;
  DefaultDecayTimeDirectiveSyntax *pDVar13;
  
  pDVar13 = (DefaultDecayTimeDirectiveSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefaultDecayTimeDirectiveSyntax *)this->endPtr < pDVar13 + 1) {
    pDVar13 = (DefaultDecayTimeDirectiveSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pDVar13 + 1);
  }
  (pDVar13->time).info = (args->time).info;
  SVar11 = (args->super_DirectiveSyntax).super_SyntaxNode.kind;
  uVar12 = *(undefined4 *)&(args->super_DirectiveSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DirectiveSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_DirectiveSyntax).super_SyntaxNode.previewNode;
  TVar7 = (args->super_DirectiveSyntax).directive.kind;
  uVar8 = (args->super_DirectiveSyntax).directive.field_0x2;
  NVar9.raw = (args->super_DirectiveSyntax).directive.numFlags.raw;
  uVar10 = (args->super_DirectiveSyntax).directive.rawLen;
  TVar3 = (args->time).kind;
  uVar4 = (args->time).field_0x2;
  NVar5.raw = (args->time).numFlags.raw;
  uVar6 = (args->time).rawLen;
  (pDVar13->super_DirectiveSyntax).directive.info = (args->super_DirectiveSyntax).directive.info;
  (pDVar13->time).kind = TVar3;
  (pDVar13->time).field_0x2 = uVar4;
  (pDVar13->time).numFlags = (NumericTokenFlags)NVar5.raw;
  (pDVar13->time).rawLen = uVar6;
  (pDVar13->super_DirectiveSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pDVar13->super_DirectiveSyntax).directive.kind = TVar7;
  (pDVar13->super_DirectiveSyntax).directive.field_0x2 = uVar8;
  (pDVar13->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar9.raw;
  (pDVar13->super_DirectiveSyntax).directive.rawLen = uVar10;
  (pDVar13->super_DirectiveSyntax).super_SyntaxNode.kind = SVar11;
  *(undefined4 *)&(pDVar13->super_DirectiveSyntax).super_SyntaxNode.field_0x4 = uVar12;
  (pDVar13->super_DirectiveSyntax).super_SyntaxNode.parent = pSVar1;
  return pDVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }